

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedConstructorCode
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  FieldGenerator *pFVar2;
  long lVar3;
  long lVar4;
  
  io::Printer::Print(printer,"void $classname$::SharedCtor() {\n","classname",&this->classname_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"_cached_size_ = 0;\n");
  pDVar1 = this->descriptor_;
  if (0 < *(int *)(pDVar1 + 0x2c)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      pFVar2 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar1 + 0x30) + lVar3));
      (*pFVar2->_vptr_FieldGenerator[9])(pFVar2,printer);
      lVar4 = lVar4 + 1;
      pDVar1 = this->descriptor_;
      lVar3 = lVar3 + 0x78;
    } while (lVar4 < *(int *)(pDVar1 + 0x2c));
  }
  io::Printer::Print(printer,"::memset(_has_bits_, 0, sizeof(_has_bits_));\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSharedConstructorCode(io::Printer* printer) {
  printer->Print(
    "void $classname$::SharedCtor() {\n",
    "classname", classname_);
  printer->Indent();

  printer->Print(
    "_cached_size_ = 0;\n");

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateConstructorCode(printer);
  }

  printer->Print(
    "::memset(_has_bits_, 0, sizeof(_has_bits_));\n");

  printer->Outdent();
  printer->Print("}\n\n");
}